

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O1

void testPreviewImage(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  pointer pcVar3;
  PreviewRgba *pPVar4;
  long *plVar5;
  long *__s;
  bool bVar6;
  int iVar7;
  int iVar8;
  PreviewRgba PVar9;
  Header *pHVar10;
  Box2i *pBVar11;
  ushort *puVar12;
  size_t sVar13;
  PreviewImage *pPVar14;
  Box2i *pBVar15;
  ushort *puVar16;
  int x;
  PreviewRgba PVar17;
  int y;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  size_t sVar22;
  PreviewImage preview1;
  string filename2;
  string filename1;
  RgbaInputFile file1;
  Header header;
  RgbaOutputFile file2;
  PreviewImage local_4e0;
  long *local_4d0 [2];
  long local_4c0 [2];
  Rgba *local_4b0;
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488;
  size_t local_480;
  RgbaInputFile local_478;
  undefined1 local_440 [520];
  RgbaOutputFile local_238;
  byte abStack_218 [488];
  
  local_4a8[0] = local_498;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4a8,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4a8);
  local_4d0[0] = local_4c0;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing preview image attribute",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  __s = local_4a8[0];
  plVar5 = local_4d0[0];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
             ,0x80);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
             ,iVar7);
  pHVar10 = Imf_2_5::RgbaInputFile::header(&local_478);
  bVar6 = Imf_2_5::Header::hasPreviewImage(pHVar10);
  if (bVar6) {
    __assert_fail("!file1.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x58,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  pBVar11 = Imf_2_5::RgbaInputFile::dataWindow(&local_478);
  lVar18 = (long)(pBVar11->min).x;
  sVar22 = ((pBVar11->max).x - lVar18) + 1;
  iVar7 = (pBVar11->min).y;
  iVar8 = (((pBVar11->max).y - iVar7) + 1) * (int)sVar22;
  uVar20 = 0xffffffffffffffff;
  if (-1 < iVar8) {
    uVar20 = (long)iVar8 * 8;
  }
  puVar12 = (ushort *)operator_new__(uVar20);
  local_4b0 = (Rgba *)(puVar12 + lVar18 * -4 + (long)(iVar7 * (int)sVar22) * -4);
  Imf_2_5::RgbaInputFile::setFrameBuffer(&local_478,local_4b0,1,sVar22);
  Imf_2_5::RgbaInputFile::readPixels(&local_478,(pBVar11->min).y,(pBVar11->max).y);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating preview image",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  iVar7 = 0;
  Imf_2_5::PreviewImage::PreviewImage(&local_4e0,0x80,0x40,(PreviewRgba *)0x0);
  PVar9.r = '\0';
  PVar9.g = '\0';
  PVar9.b = '\0';
  PVar9.a = 0x80;
  do {
    iVar8 = 0;
    PVar17 = PVar9;
    do {
      local_4e0._pixels[local_4e0._width * iVar7 + iVar8] = PVar17;
      iVar8 = iVar8 + 1;
      PVar17 = (PreviewRgba)((int)PVar17 + 0x10002);
    } while (iVar8 != 0x80);
    iVar7 = iVar7 + 1;
    PVar9 = (PreviewRgba)((int)PVar9 + 0x10400);
  } while (iVar7 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar13 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar13);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  pHVar10 = Imf_2_5::RgbaInputFile::header(&local_478);
  Imf_2_5::Header::Header((Header *)local_440,pHVar10);
  Imf_2_5::Header::setPreviewImage((Header *)local_440,&local_4e0);
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&local_238,(char *)__s,(Header *)local_440,WRITE_RGBA,iVar7);
  local_480 = sVar22;
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&local_238,local_4b0,1,sVar22);
  iVar7 = (pBVar11->min).y;
  if (iVar7 <= (pBVar11->max).y) {
    iVar7 = iVar7 + -1;
    do {
      Imf_2_5::RgbaOutputFile::writePixels(&local_238,1);
      iVar7 = iVar7 + 1;
    } while (iVar7 < (pBVar11->max).y);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&local_238);
  Imf_2_5::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar13 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar13);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_440,(char *)__s,iVar7);
  pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)local_440);
  bVar6 = Imf_2_5::Header::hasPreviewImage(pHVar10);
  if (!bVar6) {
    __assert_fail("file2.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x82,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  pHVar10 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)local_440);
  pPVar14 = Imf_2_5::Header::previewImage(pHVar10);
  pPVar4 = pPVar14->_pixels;
  lVar18 = 0;
  do {
    if (local_4e0._pixels[lVar18].r != pPVar4[lVar18].r) {
      __assert_fail("preview1.pixels()[i].r == preview2.pixels()[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x88,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar18].g != pPVar4[lVar18].g) {
      __assert_fail("preview1.pixels()[i].g == preview2.pixels()[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x89,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar18].b != pPVar4[lVar18].b) {
      __assert_fail("preview1.pixels()[i].b == preview2.pixels()[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x8a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar18].a != pPVar4[lVar18].a) {
      __assert_fail("preview1.pixels()[i].a == preview2.pixels()[i].a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x8b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x2000);
  pBVar15 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)local_440);
  local_488 = plVar5;
  iVar7 = (pBVar11->min).x;
  if ((((iVar7 != (pBVar15->min).x) || (iVar8 = (pBVar11->min).y, iVar8 != (pBVar15->min).y)) ||
      (iVar19 = (pBVar11->max).x, iVar19 != (pBVar15->max).x)) ||
     (iVar21 = (pBVar11->max).y, iVar21 != (pBVar15->max).y)) {
    __assert_fail("dw == file2.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x8e,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  iVar19 = (iVar19 - iVar7) + 1;
  iVar21 = ((iVar21 - iVar8) + 1) * iVar19;
  uVar20 = 0xffffffffffffffff;
  if (-1 < iVar21) {
    uVar20 = (long)iVar21 * 8;
  }
  puVar16 = (ushort *)operator_new__(uVar20);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            ((RgbaInputFile *)local_440,
             (Rgba *)(puVar16 + (long)iVar7 * -4 + (long)(iVar8 * iVar19) * -4),1,(long)iVar19);
  Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)local_440,(pBVar11->min).y,(pBVar11->max).y);
  sVar22 = local_480;
  plVar5 = local_488;
  if (0 < iVar21) {
    fVar2 = *(float *)((long)&half::_toFloat + (ulong)*puVar12 * 4);
    pfVar1 = (float *)((long)&half::_toFloat + (ulong)*puVar16 * 4);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      __assert_fail("pixels1[i].r == pixels2[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    fVar2 = *(float *)((long)&half::_toFloat + (ulong)puVar12[1] * 4);
    pfVar1 = (float *)((long)&half::_toFloat + (ulong)puVar16[1] * 4);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      __assert_fail("pixels1[i].g == pixels2[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9c,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    fVar2 = *(float *)((long)&half::_toFloat + (ulong)puVar12[2] * 4);
    pfVar1 = (float *)((long)&half::_toFloat + (ulong)puVar16[2] * 4);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      __assert_fail("pixels1[i].b == pixels2[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9d,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    fVar2 = *(float *)((long)&half::_toFloat + (ulong)puVar12[3] * 4);
    pfVar1 = (float *)((long)&half::_toFloat + (ulong)puVar16[3] * 4);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      __assert_fail("pixels1[i].a == pixels2[i].a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9e,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  operator_delete__(puVar16);
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (plVar5 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar13 = strlen((char *)plVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar5,sVar13);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  pHVar10 = Imf_2_5::RgbaInputFile::header(&local_478);
  Imf_2_5::Header::Header((Header *)local_440,pHVar10);
  Imf_2_5::PreviewImage::PreviewImage((PreviewImage *)&local_238,0x80,0x40,(PreviewRgba *)0x0);
  Imf_2_5::Header::setPreviewImage((Header *)local_440,(PreviewImage *)&local_238);
  Imf_2_5::PreviewImage::~PreviewImage((PreviewImage *)&local_238);
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&local_238,(char *)plVar5,(Header *)local_440,WRITE_RGBA,iVar7);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&local_238,local_4b0,1,sVar22);
  iVar7 = (pBVar11->min).y;
  if (iVar7 <= (pBVar11->max).y) {
    do {
      Imf_2_5::RgbaOutputFile::writePixels(&local_238,1);
      if (iVar7 == ((pBVar11->max).y + (pBVar11->min).y) / 2) {
        Imf_2_5::RgbaOutputFile::updatePreviewImage(&local_238,local_4e0._pixels);
      }
      bVar6 = iVar7 < (pBVar11->max).y;
      iVar7 = iVar7 + 1;
    } while (bVar6);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&local_238);
  Imf_2_5::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar13 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (plVar5 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x442478);
  }
  else {
    sVar13 = strlen((char *)plVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar5,sVar13);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::ifstream::ifstream(local_440);
  std::ifstream::ifstream(&local_238);
  std::filebuf::open(local_440 + 0x10,(_Ios_Openmode)__s);
  std::filebuf::open((char *)&local_238._toYca,(_Ios_Openmode)plVar5);
  while( true ) {
    iVar7 = std::istream::get();
    iVar8 = std::istream::get();
    if ((*(uint *)(*(_func_int **)(local_440._0_8_ + -0x18) + (long)(local_440 + 0x20)) & 2) != 0) {
      std::ifstream::~ifstream(&local_238);
      std::ifstream::~ifstream(local_440);
      remove((char *)__s);
      remove((char *)plVar5);
      Imf_2_5::PreviewImage::~PreviewImage(&local_4e0);
      operator_delete__(puVar12);
      Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_478);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      if (local_4d0[0] != local_4c0) {
        operator_delete(local_4d0[0],local_4c0[0] + 1);
      }
      if (local_4a8[0] != local_498) {
        operator_delete(local_4a8[0],local_498[0] + 1);
      }
      return;
    }
    if (iVar7 != iVar8) break;
    if (((*(uint *)(*(_func_int **)(local_440._0_8_ + -0x18) + (long)(local_440 + 0x20)) & 5) != 0)
       || ((abStack_218[(long)local_238._vptr_RgbaOutputFile[-3]] & 5) != 0)) {
      __assert_fail("!!file2 && !!file3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0xc6,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  __assert_fail("c2 == c3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                ,0xc5,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string &tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
	cout << "Testing preview image attribute" << endl;

	readWriteFiles (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
			filename1.c_str(),
			filename2.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}